

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

datetime * __thiscall cppcms::filters::datetime::operator=(datetime *this,datetime *other)

{
  to_stream_type p_Var1;
  to_string_type p_Var2;
  type_info *ptVar3;
  
  if (other != this) {
    p_Var1 = (other->time_).to_stream_;
    p_Var2 = (other->time_).to_string_;
    ptVar3 = (other->time_).type_;
    (this->time_).ptr_ = (other->time_).ptr_;
    (this->time_).to_stream_ = p_Var1;
    (this->time_).to_string_ = p_Var2;
    (this->time_).type_ = ptVar3;
  }
  std::__cxx11::string::_M_assign((string *)&this->tz_);
  return this;
}

Assistant:

datetime const &datetime::operator=(datetime const &other) { time_=other.time_; tz_ = other.tz_; return *this; }